

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsInt __thiscall HEkk::computeFactor(HEkk *this)

{
  HighsSimplexAnalysis *this_00;
  HighsInt *pHVar1;
  pointer pHVar2;
  bool assert_condition;
  HighsInt HVar3;
  string local_68;
  string local_48;
  
  HVar3 = 0;
  if ((this->status_).has_fresh_invert == false) {
    pHVar2 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->bad_basis_change_).
        super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
        ._M_impl.super__Vector_impl_data._M_finish != pHVar2) {
      (this->bad_basis_change_).
      super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar2;
    }
    assert_condition = lpFactorRowCompatible(this);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"HEkk::computeFactor: lpFactorRowCompatible","");
    highsAssert(assert_condition,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    this_00 = &this->analysis_;
    HighsSimplexAnalysis::simplexTimerStart(this_00,0x1b,0);
    HVar3 = HSimplexNla::invert(&this->simplex_nla_);
    HighsSimplexAnalysis::simplexTimerStop(this_00,0x1b,0);
    (this->hot_start_).refactor_info.use = (this->simplex_nla_).factor_.refactor_info_.use;
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->hot_start_).refactor_info.pivot_row,
               &(this->simplex_nla_).factor_.refactor_info_.pivot_row);
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->hot_start_).refactor_info.pivot_var,
               &(this->simplex_nla_).factor_.refactor_info_.pivot_var);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(this->hot_start_).refactor_info.pivot_type,
               &(this->simplex_nla_).factor_.refactor_info_.pivot_type);
    (this->hot_start_).refactor_info.build_synthetic_tick =
         (this->simplex_nla_).factor_.refactor_info_.build_synthetic_tick;
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(this->hot_start_).nonbasicMove,&(this->basis_).nonbasicMove_);
    (this->hot_start_).valid = true;
    if ((this->analysis_).analyse_factor_data == true) {
      HighsSimplexAnalysis::updateInvertFormData(this_00,&(this->simplex_nla_).factor_);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"HEkk::computeFactor - original","");
    debugNlaCheckInvert(this,&local_68,-(uint)(HVar3 == 0) | 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    (this->status_).has_invert = HVar3 == 0;
    (this->status_).has_fresh_invert = HVar3 == 0;
    (this->info_).update_count = 0;
    pHVar1 = &(this->simplex_stats_).num_invert;
    *pHVar1 = *pHVar1 + 1;
  }
  return HVar3;
}

Assistant:

HighsInt HEkk::computeFactor() {
  assert(status_.has_nla);
  if (status_.has_fresh_invert) return 0;
  // Clear any bad basis changes
  clearBadBasisChange();
  highsAssert(lpFactorRowCompatible(),
              "HEkk::computeFactor: lpFactorRowCompatible");
  // Perform INVERT
  analysis_.simplexTimerStart(InvertClock);
  const HighsInt rank_deficiency = simplex_nla_.invert();
  analysis_.simplexTimerStop(InvertClock);
  //
  // Set up hot start information
  hot_start_.refactor_info = simplex_nla_.factor_.refactor_info_;
  hot_start_.nonbasicMove = basis_.nonbasicMove_;
  hot_start_.valid = true;

  if (analysis_.analyse_factor_data)
    analysis_.updateInvertFormData(simplex_nla_.factor_);

  HighsInt alt_debug_level = -1;
  if (rank_deficiency) alt_debug_level = kHighsDebugLevelCostly;
  debugNlaCheckInvert("HEkk::computeFactor - original", alt_debug_level);

  if (rank_deficiency) {
    // Have an invertible representation, but of B with column(s)
    // replacements due to singularity. So no (fresh) representation of
    // B^{-1}
    status_.has_invert = false;
    status_.has_fresh_invert = false;
  } else {
    // Now have a representation of B^{-1}, and it is fresh!
    status_.has_invert = true;
    status_.has_fresh_invert = true;
  }
  // Set the update count to zero since the corrected invertible
  // representation may be used for an initial basis. In any case the
  // number of updates shouldn't be positive
  info_.update_count = 0;

  simplex_stats_.num_invert++;
  return rank_deficiency;
}